

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGenInitializer::InfoWriter::ListJoin<std::_Rb_tree_const_iterator<std::__cxx11::string>>
          (string *__return_storage_ptr__,InfoWriter *this,
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          it_begin,_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   it_end)

{
  byte bVar1;
  _Rb_tree_node_base *p_Var2;
  byte *pbVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = (_Rb_tree_node_base *)this;
  if ((_Base_ptr)this != it_begin._M_node) {
    do {
      if (p_Var2 != (_Rb_tree_node_base *)this) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pbVar3 = *(byte **)(p_Var2 + 1);
LAB_00353bdb:
      bVar1 = *pbVar3;
      if (0x3a < bVar1) {
        if ((bVar1 == 0x3b) || (bVar1 == 0x5c)) goto LAB_00353c11;
LAB_00353c1e:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
LAB_00353c19:
        pbVar3 = pbVar3 + 1;
        goto LAB_00353bdb;
      }
      if ((bVar1 == 0x22) || (bVar1 == 0x24)) {
LAB_00353c11:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        goto LAB_00353c19;
      }
      if (bVar1 != 0) goto LAB_00353c1e;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != it_begin._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenInitializer::InfoWriter::ListJoin(IT it_begin,
                                                         IT it_end)
{
  std::string res;
  for (IT it = it_begin; it != it_end; ++it) {
    if (it != it_begin) {
      res += ';';
    }
    for (const char* c = it->c_str(); *c; ++c) {
      if (*c == '"') {
        // Escape the double quote to avoid ending the argument.
        res += "\\\"";
      } else if (*c == '$') {
        // Escape the dollar to avoid expanding variables.
        res += "\\$";
      } else if (*c == '\\') {
        // Escape the backslash to avoid other escapes.
        res += "\\\\";
      } else if (*c == ';') {
        // Escape the semicolon to avoid list expansion.
        res += "\\;";
      } else {
        // Other characters will be parsed correctly.
        res += *c;
      }
    }
  }
  return res;
}